

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_slt_imm(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int rs,int16_t imm)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGCond cond;
  TCGv_i64 t;
  undefined6 in_register_00000082;
  uintptr_t o;
  
  if (rt == 0) {
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,t,rs);
  if (opc == 0x28000000) {
    cond = TCG_COND_LT;
  }
  else {
    if (opc != 0x2c000000) goto LAB_00876a64;
    cond = TCG_COND_LTU;
  }
  tcg_gen_setcondi_i64_mips64el
            (tcg_ctx,cond,tcg_ctx->cpu_gpr[(uint)rt],t,(long)(int)CONCAT62(in_register_00000082,imm)
            );
LAB_00876a64:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_slt_imm(DisasContext *ctx, uint32_t opc,
                        int rt, int rs, int16_t imm)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm = (target_long)imm; /* Sign extend to 32/64 bits */
    TCGv t0;

    if (rt == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }
    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    switch (opc) {
    case OPC_SLTI:
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_SLTIU:
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LTU, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    }
    tcg_temp_free(tcg_ctx, t0);
}